

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::RgbaOutputFile::RgbaOutputFile
          (RgbaOutputFile *this,char *name,Box2i *displayWindow,Box2i *dataWindow,
          RgbaChannels rgbaChannels,float pixelAspectRatio,V2f *screenWindowCenter,
          float screenWindowWidth,LineOrder lineOrder,Compression compression,int numThreads)

{
  OutputFile *this_00;
  ToYca *this_01;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  Header hd;
  
  this->_vptr_RgbaOutputFile = (_func_int **)&PTR__RgbaOutputFile_001e3fc8;
  this->_outputFile = (OutputFile *)0x0;
  this->_toYca = (ToYca *)0x0;
  iVar2 = -(uint)((dataWindow->max).x < (dataWindow->min).x);
  iVar3 = -(uint)((dataWindow->max).y < (dataWindow->min).y);
  auVar1._4_4_ = iVar2;
  auVar1._0_4_ = iVar2;
  auVar1._8_4_ = iVar3;
  auVar1._12_4_ = iVar3;
  iVar2 = movmskpd(0x1e3fc8,auVar1);
  if (iVar2 != 0) {
    dataWindow = displayWindow;
  }
  Header::Header(&hd,displayWindow,dataWindow,pixelAspectRatio,screenWindowCenter,screenWindowWidth,
                 lineOrder,compression);
  anon_unknown_1::insertChannels(&hd,rgbaChannels);
  this_00 = (OutputFile *)operator_new(0x10);
  OutputFile::OutputFile(this_00,name,&hd,numThreads);
  this->_outputFile = this_00;
  if ((rgbaChannels & WRITE_YC) != 0) {
    this_01 = (ToYca *)operator_new(0x160);
    ToYca::ToYca(this_01,this_00,rgbaChannels);
    this->_toYca = this_01;
  }
  Header::~Header(&hd);
  return;
}

Assistant:

RgbaOutputFile::RgbaOutputFile (
    const char                    name[],
    const IMATH_NAMESPACE::Box2i& displayWindow,
    const IMATH_NAMESPACE::Box2i& dataWindow,
    RgbaChannels                  rgbaChannels,
    float                         pixelAspectRatio,
    const IMATH_NAMESPACE::V2f    screenWindowCenter,
    float                         screenWindowWidth,
    LineOrder                     lineOrder,
    Compression                   compression,
    int                           numThreads)
    : _outputFile (0), _toYca (0)
{
    Header hd (
        displayWindow,
        dataWindow.isEmpty () ? displayWindow : dataWindow,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    insertChannels (hd, rgbaChannels);
    _outputFile = new OutputFile (name, hd, numThreads);

    if (rgbaChannels & (WRITE_Y | WRITE_C))
        _toYca = new ToYca (*_outputFile, rgbaChannels);
}